

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2pointutil.cc
# Opt level: O2

S2Point * S2::FromFrame(S2Point *__return_storage_ptr__,Matrix3x3_d *m,S2Point *q)

{
  Matrix3x3<double>::operator*(m,q);
  return __return_storage_ptr__;
}

Assistant:

S2Point FromFrame(const Matrix3x3_d& m, const S2Point& q) {
  return m * q;
}